

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::TPZMHMeshControl(TPZMHMeshControl *this,TPZMHMeshControl *copy)

{
  undefined8 *in_RDI;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffff90;
  TPZMHMeshControl *cp;
  TPZMHMeshControl *this_00;
  
  *in_RDI = &PTR__TPZMHMeshControl_025a2ca0;
  TPZAutoPointer<TPZGeoMesh>::TPZAutoPointer
            ((TPZAutoPointer<TPZGeoMesh> *)in_stack_ffffffffffffff90);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff90);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff90);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff90);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff90);
  *(undefined4 *)(in_RDI + 6) = 1;
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  *(undefined4 *)(in_RDI + 7) = 4;
  *(undefined4 *)((long)in_RDI + 0x3c) = 3;
  *(undefined4 *)(in_RDI + 8) = 6;
  *(undefined4 *)((long)in_RDI + 0x44) = 0x226;
  *(undefined4 *)(in_RDI + 9) = 0x227;
  cp = (TPZMHMeshControl *)(in_RDI + 10);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e089a5);
  this_00 = (TPZMHMeshControl *)(in_RDI + 0x10);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e089b8);
  *(undefined4 *)(in_RDI + 0x16) = 1;
  *(undefined4 *)((long)in_RDI + 0xb4) = 1;
  *(undefined4 *)(in_RDI + 0x17) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 500;
  *(undefined4 *)(in_RDI + 0x18) = 0x1f6;
  *(undefined4 *)((long)in_RDI + 0xc4) = 0x1f5;
  TPZManVector<long,_10>::TPZManVector((TPZManVector<long,_10> *)this_00,(int64_t)cp);
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::map
            ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             0x1e08a26);
  std::
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         *)0x1e08a3c);
  std::
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::map((map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
         *)0x1e08a52);
  *(undefined1 *)(in_RDI + 0x39) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ca) = 0;
  operator=(this_00,cp);
  return;
}

Assistant:

TPZMHMeshControl::TPZMHMeshControl(const TPZMHMeshControl &copy){

    this->operator=(copy);
}